

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strljustify_s.c
# Opt level: O3

errno_t strljustify_s(char *dest,rsize_t dmax)

{
  long lVar1;
  long lVar2;
  char cVar3;
  rsize_t rVar4;
  errno_t error;
  long lVar5;
  errno_t eVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar7 = "strljustify_s_s: dest is null";
    eVar6 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    pcVar7 = "strljustify_s_s: dmax is 0";
    eVar6 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      cVar3 = *dest;
      if (dmax == 1 || cVar3 == '\0') {
        *dest = '\0';
        eVar6 = 0;
      }
      else {
        rVar4 = 0;
        do {
          if (dmax == rVar4) {
            memset(dest,0,dmax);
            pcVar7 = "strljustify_s: dest is unterminated";
            eVar6 = 0x197;
            error = 0x197;
            goto LAB_00105ebe;
          }
          lVar5 = rVar4 + 1;
          rVar4 = rVar4 + 1;
        } while (dest[lVar5] != '\0');
        lVar5 = 0;
        while ((cVar3 == ' ' || (cVar3 == '\t'))) {
          lVar2 = lVar5 + 1;
          lVar5 = lVar5 + 1;
          cVar3 = dest[lVar2];
        }
        eVar6 = 0;
        if (cVar3 != '\0' && lVar5 != 0) {
          pcVar7 = dest + lVar5 + 1;
          do {
            *dest = cVar3;
            dest = dest + 1;
            pcVar7[-1] = ' ';
            cVar3 = *pcVar7;
            pcVar7 = pcVar7 + 1;
          } while (cVar3 != '\0');
          *dest = '\0';
        }
      }
      goto LAB_00105ec3;
    }
    pcVar7 = "strljustify_s_s: dmax exceeds max";
    eVar6 = 0x193;
    error = 0x193;
  }
LAB_00105ebe:
  invoke_safe_str_constraint_handler(pcVar7,(void *)0x0,error);
LAB_00105ec3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar6;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strljustify_s (char *dest, rsize_t dmax)
{
    char *orig_dest;
    rsize_t orig_dmax;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /*
     * corner case, a dmax of one allows only for a null
     */
    if (*dest == '\0' || dmax <= RSIZE_MIN_STR) {
        *dest = '\0';
        return (EOK);
    }

    orig_dmax = dmax;
    orig_dest = dest;

     /*
      * scan the string to be sure it is properly terminated
      */
     while (*dest) {
        if (dmax == 0) {
            while (orig_dmax) { *orig_dest++ = '\0';  orig_dmax--; }

            invoke_safe_str_constraint_handler(
                      "strljustify_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (ESUNTERM);
        }
        dmax--;
        dest++;
    }

    /*
     * find first non-white space char
     */
    dest = orig_dest;
    while ((*dest == ' ') || (*dest == '\t')) {
        dest++;
    }

   /*
    * shift text, removing spaces, to left justify
    */
    if (orig_dest != dest && *dest) {
        while (*dest) {
            *orig_dest++ = *dest;
            *dest++ = ' ';
        }
        *orig_dest = '\0';
    }

    return (EOK);
}